

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

int BuiltinCallLineSpecial
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int val;
  long lVar1;
  int iVar2;
  code *pcStack_40;
  int v [5];
  
  if (4 < numparam - 3U) {
    pcStack_40 = (code *)0x516321;
    __assert_fail("numparam > 2 && numparam < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x1dd9,
                  "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type == '\0') {
    if (param[1].field_0.field_3.Type != '\x03') {
      pcStack_40 = (code *)0x51635f;
      __assert_fail("param[1].Type == REGT_POINTER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x1ddb,
                    "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    v[4] = 0;
    v[0] = 0;
    v[1] = 0;
    v[2] = 0;
    v[3] = 0;
    pcStack_40 = (code *)0x8;
    for (lVar1 = 8; (ulong)(uint)numparam << 2 != lVar1; lVar1 = lVar1 + 4) {
      *(undefined4 *)((long)v + lVar1 + -8) = *(undefined4 *)((long)&param->field_0 + lVar1 * 4);
    }
    iVar2 = 0;
    val = P_ExecuteSpecial((param->field_0).i,(line_t *)0x0,(AActor *)param[1].field_0.field_1.a,
                           false,v[0],v[1],(int)v._8_8_,v[3],v[4]);
    if (0 < numret) {
      if (ret == (VMReturn *)0x0) {
        pcStack_40 = FxActionSpecialCall::Emit;
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1de2,
                      "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcStack_40 = (code *)0x5162f0;
      VMReturn::SetInt(ret,val);
      iVar2 = 1;
    }
    return iVar2;
  }
  pcStack_40 = (code *)0x516340;
  __assert_fail("param[0].Type == REGT_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x1dda,
                "int BuiltinCallLineSpecial(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

int BuiltinCallLineSpecial(VMValue *param, TArray<VMValue> &defaultparam, int numparam, VMReturn *ret, int numret)
{
	assert(numparam > 2 && numparam < 8);
	assert(param[0].Type == REGT_INT);
	assert(param[1].Type == REGT_POINTER);
	int v[5] = { 0 };

	for (int i = 2; i < numparam; ++i)
	{
		v[i - 2] = param[i].i;
	}
	ACTION_RETURN_INT(P_ExecuteSpecial(param[0].i, nullptr, reinterpret_cast<AActor*>(param[1].a), false, v[0], v[1], v[2], v[3], v[4]));
}